

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTableGrowSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  if (expr->_id != TableGrowId) {
    __assert_fail("expression->is<TableGrow>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa0c,
                  "void BinaryenTableGrowSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xa0d,
                "void BinaryenTableGrowSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenTableGrowSetValue(BinaryenExpressionRef expr,
                               BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGrow>());
  assert(valueExpr);
  static_cast<TableGrow*>(expression)->value = (Expression*)valueExpr;
}